

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::anon_unknown_1::TextureVertexShader::shadeVertices
          (TextureVertexShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  Vec4 position;
  Vec4 local_58;
  VertexPacket **local_48;
  TextureFormat local_40;
  int aiStack_38 [2];
  
  if (0 < numPackets) {
    uVar5 = 0;
    local_48 = packets;
    do {
      pVVar1 = local_48[uVar5];
      local_58.m_data[0] = 0.0;
      local_58.m_data[1] = 0.0;
      local_58.m_data[2] = 0.0;
      local_58.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_58,inputs,pVVar1->instanceNdx,pVVar1->vertexNdx);
      uVar6 = -(uint)(local_58.m_data[0] * 4.0 < 0.0);
      uVar7 = -(uint)(local_58.m_data[1] * 4.0 < 0.0);
      iVar2 = ((int)((float)(~uVar7 & 0x3f000000 | uVar7 & 0xbf000000) + local_58.m_data[1] * 4.0) +
              4) * ((int)((float)(~uVar6 & 0x3f000000 | uVar6 & 0xbf000000) +
                         local_58.m_data[0] * 4.0) + 4);
      iVar4 = (this->m_texture).m_size.m_data[0] + -1;
      iVar3 = iVar2;
      if (iVar4 <= iVar2) {
        iVar3 = iVar4;
      }
      iVar4 = 0;
      if (-1 < iVar2) {
        iVar4 = iVar3;
      }
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&local_40,(int)this + 0x38,iVar4,0);
      *(TextureFormat *)&pVVar1->outputs[0].v = local_40;
      *(int (*) [2])((long)&pVVar1->outputs[0].v + 8) = aiStack_38;
      (pVVar1->position).m_data[0] = local_58.m_data[0] + -0.5 + local_58.m_data[0] + -0.5;
      (pVVar1->position).m_data[1] = local_58.m_data[1] + -0.5 + local_58.m_data[1] + -0.5;
      (pVVar1->position).m_data[2] = 0.0;
      (pVVar1->position).m_data[3] = 1.0;
      uVar5 = uVar5 + 1;
    } while ((uint)numPackets != uVar5);
  }
  return;
}

Assistant:

void shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			rr::VertexPacket* const		packet		= packets[packetNdx];
			tcu::Vec4					position;
			tcu::Vec4					texelValue;

			readVertexAttrib(position, inputs[0], packet->instanceNdx, packet->vertexNdx);

			texelValue	= tcu::Vec4(m_texture.getPixel(de::clamp<int>((deRoundFloatToInt32(position.x() * 4) + 4) * (deRoundFloatToInt32(position.y() * 4) + 4), 0, m_texture.getWidth()-1), 0));

			packet->outputs[0]	= texelValue;
			packet->position	= tcu::Vec4(2.0f * (position.x() - 0.5f), 2.0f * (position.y() - 0.5f), 0.0f, 1.0f);
		}
	}